

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magics.cpp
# Opt level: O3

U64 magics::attacks<(Piece)3>(Square *s,U64 *block)

{
  Square SVar1;
  void *pvVar2;
  int *piVar3;
  int *piVar4;
  U64 UVar5;
  uint uVar6;
  Square SVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  steps;
  allocator_type local_c3;
  allocator_type local_c2;
  allocator_type local_c1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  int local_48 [10];
  
  local_88 = 0;
  uStack_80 = 0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_90 = 0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48[4] = -7;
  local_48[5] = 7;
  local_48[6] = -9;
  local_48[7] = 9;
  __l._M_len = 4;
  __l._M_array = local_48 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_c1);
  local_48[0] = -1;
  local_48[1] = 1;
  local_48[2] = -8;
  local_48[3] = 8;
  __l_00._M_len = 4;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l_00,&local_c2);
  __l_01._M_len = 4;
  __l_01._M_array = &local_a8;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c0,__l_01,&local_c3);
  lVar12 = 0x60;
  do {
    pvVar2 = *(void **)((long)&local_c0.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar12);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&local_c0.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar12) - (long)pvVar2);
    }
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != 0);
  piVar4 = local_c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar3 = local_c0.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar4 == piVar3) {
    UVar5 = 0;
  }
  else {
    SVar1 = *s;
    UVar5 = 0;
    do {
      uVar9 = 0;
      uVar10 = 1;
      uVar8 = (long)(int)SVar1;
      do {
        uVar8 = uVar8 + (long)*piVar4;
        if (uVar8 < 0x40) {
          uVar11 = ((int)SVar1 >> 3) - ((uint)(uVar8 >> 3) & 0x1fffffff);
          uVar6 = -uVar11;
          if (0 < (int)uVar11) {
            uVar6 = uVar11;
          }
          if ((uVar6 < 8) && (SVar7 = SVar1 ^ (Square)uVar8, SVar7 < A2 || (SVar7 & H1) == A1)) {
            uVar9 = uVar9 | 1L << (uVar8 & 0x3f);
          }
        }
      } while (((*block & uVar9) == 0) && (bVar13 = uVar10 < 7, uVar10 = uVar10 + 1, bVar13));
      UVar5 = UVar5 | uVar9;
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar3);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c0);
  return UVar5;
}

Assistant:

U64 magics::attacks(const Square& s, const U64& block) {
	std::vector< std::vector<int> > steps =
	{ {}, // pawn
		{}, // knight
		{-7, 7, -9, 9}, // bishop
		{-1, 1, -8, 8}  // rook
	};
	U64 bm = 0ULL;
	for (auto& step : steps[p]) {
		U64 tmp = 0ULL;
		int sqs = 1;

		while ((tmp & block) == 0ULL && sqs < 8) {
			int to = s + (sqs++) * step;
			if (util::on_board(to) &&
				util::col_dist(s, to) <= 7 &&
				util::row_dist(s, to) <= 7 &&
				((p == Piece::bishop && util::on_diagonal(s, to)) ||
					(p == Piece::rook && (util::same_row(s, to) || util::same_col(s, to))))) {
				tmp |= (1ULL << to);
			}
		}
		bm |= tmp;
	}
	return bm;
}